

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O3

void check_input(void *input_buffer,void *output_buffer,long frame_count)

{
  AssertHelper AVar1;
  bool bVar2;
  AssertHelperData *this;
  stringstream *psVar3;
  int line;
  char *message;
  AssertionResult gtest_ar;
  AssertHelper local_60;
  AssertionResult local_58;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48 [2];
  long local_38;
  AssertHelper local_30;
  void *local_28;
  
  local_48[0].ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_38 = frame_count;
  local_28 = output_buffer;
  testing::internal::CmpHelperEQ<void*,decltype(nullptr)>
            ((internal *)&local_58,"output_buffer","nullptr",&local_28,&local_48[0].ptr_);
  if (local_58.success_ == false) {
    psVar3 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar3);
    *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
    if (local_58.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_58.message_.ptr_)->_M_dataplus)._M_p;
    }
    line = 0x253;
    local_48[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3;
LAB_00109bbf:
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
               ,line,message);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_48[0].ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00109c00;
    bVar2 = testing::internal::IsTrue(true);
    AVar1.data_ = (AssertHelperData *)local_48[0].ptr_;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_58.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_48[0].ptr_._0_4_ = 0x100;
    testing::internal::CmpHelperEQ<long,int>
              ((internal *)&local_58,"frame_count","256",&local_38,(int *)local_48);
    if (local_58.success_ == false) {
      psVar3 = (stringstream *)operator_new(0x188);
      std::__cxx11::stringstream::stringstream(psVar3);
      *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
      if (local_58.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = ((local_58.message_.ptr_)->_M_dataplus)._M_p;
      }
      line = 0x254;
      local_48[0].ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3;
      goto LAB_00109bbf;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_58.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_58.success_ = input_buffer != (void *)0x0;
    local_58.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_58.success_) goto LAB_00109c00;
    this = (AssertHelperData *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream((stringstream *)this);
    *(undefined8 *)((long)&(this->message).c_str_ + *(long *)(*(long *)&this->line + -0x18)) = 0x11;
    local_60.data_ = this;
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)local_48,&local_58,"!!input_buffer","false","true");
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
               ,0x255,(char *)local_48[0].ptr_);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_48[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete__(local_48[0].ptr_);
    }
    if (local_60.data_ == (AssertHelperData *)0x0) goto LAB_00109c00;
    bVar2 = testing::internal::IsTrue(true);
    AVar1.data_ = local_60.data_;
  }
  if ((bVar2) && (AVar1.data_ != (AssertHelperData *)0x0)) {
    (**(code **)(*(long *)AVar1.data_ + 8))();
  }
LAB_00109c00:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

void check_input(const void * input_buffer, void * output_buffer, long frame_count)
{
  ASSERT_EQ(output_buffer, nullptr);
  ASSERT_EQ(frame_count, 256);
  ASSERT_TRUE(!!input_buffer);
}